

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forStruct
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  Type *lhs;
  Compilation *compilation;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *syntax_00;
  Expression *pEVar4;
  FieldSymbol *pFVar5;
  SyntaxNode *this;
  reference ppTVar6;
  SourceLocation location;
  Diagnostic *pDVar7;
  undefined4 extraout_var;
  ReplicatedAssignmentPatternExpression *expr;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  size_t i;
  EVP_PKEY_CTX *pEVar8;
  size_type index;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range3;
  byte bVar9;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> iVar10;
  size_t count;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_110;
  ReplicatedAssignmentPatternSyntax *local_100;
  EVP_PKEY_CTX *local_f8;
  ASTContext *local_f0;
  Token local_e8;
  Type *local_d8;
  Compilation *local_d0;
  Expression *local_c8;
  ulong local_c0;
  EVP_PKEY_CTX *local_b8;
  undefined1 local_b0 [64];
  SmallVectorBase<const_slang::ast::Type_*> local_70 [2];
  
  local_b8 = (EVP_PKEY_CTX *)0x0;
  local_100 = syntax;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->countExpr);
  local_f0 = context;
  pEVar4 = bindReplCount(comp,syntax_00,context,(size_t *)&local_b8);
  bVar2 = Expression::bad(pEVar4);
  if (bVar2) {
    pEVar4 = Expression::badExpr(comp,(Expression *)0x0);
    return pEVar4;
  }
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_c8 = pEVar4;
  iVar10 = Scope::membersOfType<slang::ast::FieldSymbol>(structScope);
  local_b0._0_8_ = iVar10.m_begin.current;
  while ((Symbol *)local_b0._0_8_ != iVar10.m_end.current.current) {
    pFVar5 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)local_b0._0_8_);
    local_110.data_ =
         (pointer)DeclaredType::getType
                            (&(pFVar5->super_VariableSymbol).super_ValueSymbol.declaredType);
    SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
              ((SmallVectorBase<slang::ast::Type_const*> *)local_70,(Type **)&local_110);
    Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::operator++
              ((specific_symbol_iterator<slang::ast::FieldSymbol> *)local_b0);
  }
  local_f8 = local_b8;
  if (local_70[0].len == ((local_100->items).elements.size_ + 1 >> 1) * (long)local_b8) {
    pSVar1 = &local_100->items;
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    index = 0;
    bVar9 = 0;
    src = local_b8;
    local_d8 = type;
    local_d0 = comp;
    for (pEVar8 = (EVP_PKEY_CTX *)0x0; compilation = local_d0, pEVar8 != local_f8;
        pEVar8 = pEVar8 + 1) {
      local_110.size_ = 0;
      local_c0 = (local_100->items).elements.size_ + 1 >> 1;
      local_110.data_ = (pointer)pSVar1;
      for (; ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_110.data_ != pSVar1 ||
             (local_110.size_ != local_c0)); local_110.size_ = local_110.size_ + 1) {
        this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                iterator_base<const_slang::syntax::ExpressionSyntax_*>::operator*
                          ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&local_110)->
                super_SyntaxNode;
        ppTVar6 = SmallVectorBase<const_slang::ast::Type_*>::operator[](local_70,index);
        lhs = *ppTVar6;
        local_e8 = slang::syntax::SyntaxNode::getFirstToken(this);
        location = parsing::Token::location(&local_e8);
        pEVar4 = Expression::bindRValue
                           (lhs,(ExpressionSyntax *)this,location,local_f0,
                            (bitmask<slang::ast::ASTFlags>)0x0);
        local_e8._0_8_ = pEVar4;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                   (Expression **)&local_e8);
        bVar2 = Expression::bad(pEVar4);
        bVar9 = bVar9 | bVar2;
        index = index + 1;
        src = extraout_RDX;
      }
    }
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,
                       (EVP_PKEY_CTX *)local_d0,src);
    local_110.data_ = (pointer)CONCAT44(extraout_var,iVar3);
    expr = BumpAllocator::
           emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                     (&compilation->super_BumpAllocator,local_d8,local_c8,&local_110,&sourceRange);
    if (bVar9 != 0) {
      expr = (ReplicatedAssignmentPatternExpression *)
             Expression::badExpr(compilation,(Expression *)expr);
    }
    SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
              ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0);
  }
  else {
    pDVar7 = ASTContext::addDiag(local_f0,(DiagCode)0x970007,sourceRange);
    pDVar7 = ast::operator<<(pDVar7,type);
    pDVar7 = Diagnostic::operator<<(pDVar7,local_70[0].len);
    Diagnostic::operator<<(pDVar7,((local_100->items).elements.size_ + 1 >> 1) * (long)local_f8);
    expr = (ReplicatedAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)0x0);
  }
  SmallVectorBase<const_slang::ast::Type_*>::~SmallVectorBase(local_70);
  return (Expression *)expr;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forStruct(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size() * count) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size() * count;
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    size_t index = 0;
    SmallVector<const Expression*> elems;
    for (size_t i = 0; i < count; i++) {
        for (auto item : syntax.items) {
            auto& expr = Expression::bindRValue(*types[index++], *item,
                                                item->getFirstToken().location(), context);
            elems.push_back(&expr);
            bad |= expr.bad();
        }
    }

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr,
                                                                      elems.copy(comp),
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}